

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O3

int CoreVfprintf(CPalThread *pthrCurrent,PAL_FILE *stream,char *format,__va_list_tag *aparg)

{
  LPCWSTR lpWideCharStr;
  FILE *pFVar1;
  BOOL BVar2;
  undefined1 auVar3 [4];
  int iVar4;
  INT IVar5;
  int iVar6;
  DWORD DVar7;
  INT *pIVar8;
  ulong uVar9;
  LPSTR lpMultiByteStr;
  LPSTR pCVar10;
  INT *pIVar11;
  byte *pbVar12;
  undefined8 *puVar13;
  size_t sVar14;
  short *psVar15;
  int *piVar16;
  uint *puVar17;
  WCHAR *pWVar18;
  CPalThread *pCVar19;
  CPalThread *pthrCurrent_00;
  undefined8 uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  long in_FS_OFFSET;
  ulong uStack_4b8;
  CHAR TempBuffer [5];
  uint local_498;
  int local_494;
  INT Prefix;
  INT Type;
  PAL_FILE *local_488;
  WCHAR local_47e;
  uint local_47c;
  WCHAR TempWChar;
  CPalThread *pCStack_478;
  INT Flags;
  LPCSTR Fmt;
  INT *pIStack_468;
  INT Precision;
  int local_45c;
  undefined1 auStack_458 [4];
  INT Width;
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  auStack_458 = (undefined1  [4])aparg->gp_offset;
  Width = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  pIStack_468 = &stream->PALferrorCode;
  iVar22 = 0;
  pIVar8 = pIStack_468;
  local_488 = stream;
  pCStack_478 = (CPalThread *)format;
LAB_0011c2e6:
  if (*(char *)&pCStack_478->_vptr_CPalThread == '%') {
    pCVar19 = pCStack_478;
    BVar2 = Internal_ExtractFormatA
                      (pCStack_478,(LPCSTR *)&stack0xfffffffffffffb88,local_438,(LPINT)&local_47c,
                       &local_45c,(LPINT)((long)&Fmt + 4),(LPINT)&local_498,&local_494);
    uVar20 = ap[0]._0_8_;
    iVar6 = local_45c;
    pIVar11 = pIStack_468;
    uVar23 = local_47c;
    iVar4 = local_494;
    uVar21 = local_498;
    if (BVar2 == 0) goto LAB_0011c3a2;
    if (local_494 != 2 || (local_498 ^ 2) != 0) {
      if ((local_498 ^ 2) == 0 && local_494 == 1) {
        auVar3 = auStack_458;
        if (local_45c + 3U < 2) {
          if ((uint)auStack_458 < 0x29) {
            auVar3 = (undefined1  [4])((int)auStack_458 + 8);
            _auStack_458 = CONCAT44(Width,auVar3);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Fmt._4_4_ & 0xfffffffd) == 0xfffffffc) {
          if ((uint)auVar3 < 0x29) {
            auVar3 = (undefined1  [4])((int)auVar3 + 8);
            _auStack_458 = CONCAT44(Width,auVar3);
            goto LAB_0011c69c;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_0011c6fe:
          pWVar18 = (WCHAR *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
LAB_0011c69c:
          if (0x28 < (uint)auVar3) goto LAB_0011c6fe;
          _auStack_458 = CONCAT44(Width,(int)auVar3 + 8);
          pWVar18 = (WCHAR *)((ulong)(uint)auVar3 + (long)ap[0].overflow_arg_area);
        }
        local_47e = *pWVar18;
        pCVar19 = (CPalThread *)0x0;
        iVar4 = WideCharToMultiByte(0,0,&local_47e,1,(LPSTR)&uStack_4b8,5,(LPCSTR)0x0,(LPBOOL)0x0);
        if (iVar4 == 0) {
          uVar20 = 0x958;
LAB_0011cb10:
          fprintf(_stderr,"] %s %s:%d","CoreVfprintf",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                  ,uVar20);
          pFVar1 = _stderr;
          DVar7 = GetLastError();
          fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
          goto LAB_0011cbaa;
        }
        TempBuffer[(long)iVar4 + -8] = '\0';
        IVar5 = Internal_AddPaddingVfprintf
                          (pCVar19,stream,(LPSTR)&uStack_4b8,iVar6 - iVar4,local_47c);
        if (IVar5 == -1) goto LAB_0011ca81;
        iVar22 = iVar22 + IVar5;
        pIVar8 = pIStack_468;
      }
      else {
        pIVar8 = pIVar11;
        if (local_494 == 6) {
          if (local_45c == -2) {
            uVar9 = _auStack_458 & 0xffffffff;
            if (uVar9 < 0x29) {
              _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
              pIVar11 = (INT *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              pIVar11 = (INT *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            local_45c = *pIVar11;
          }
          if (Fmt._4_4_ == 0xfffffffe) {
            uVar9 = _auStack_458 & 0xffffffff;
            if (uVar9 < 0x29) {
              _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
              puVar17 = (uint *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar17 = (uint *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            Fmt._4_4_ = *puVar17;
          }
          if (local_498 == 1) {
            uVar9 = _auStack_458 & 0xffffffff;
            if (uVar9 < 0x29) {
              _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
              puVar13 = (undefined8 *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar13 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(short *)*puVar13 = (short)iVar22;
          }
          else {
            uVar9 = _auStack_458 & 0xffffffff;
            if (uVar9 < 0x29) {
              _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
              puVar13 = (undefined8 *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar13 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(int *)*puVar13 = iVar22;
          }
        }
        else if (local_494 == 1) {
          if ((local_47c & 4) == 0) {
LAB_0011c944:
            uStack_4b8 = _auStack_458;
            TempBuffer[0] = (undefined1)ap[0].gp_offset;
            TempBuffer[1] = ap[0].gp_offset._1_1_;
            TempBuffer[2] = ap[0].gp_offset._2_1_;
            TempBuffer[3] = ap[0].gp_offset._3_1_;
            stack0xfffffffffffffb54 = ap[0].fp_offset;
            ap[0]._0_8_ = uVar20;
            iVar6 = vfprintf((FILE *)stream->bsdFilePtr,local_438,&uStack_4b8);
            PAL_printf_arg_remover((va_list *)auStack_458,local_45c,Fmt._4_4_,iVar4,uVar21);
            pIVar11 = pIStack_468;
            goto LAB_0011ca54;
          }
          uVar9 = _auStack_458 & 0xffffffff;
          if (uVar9 < 0x29) {
            _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
            pbVar12 = (byte *)(uVar9 + (long)ap[0].overflow_arg_area);
          }
          else {
            pbVar12 = (byte *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uStack_4b8._0_2_ = (ushort)*pbVar12;
          IVar5 = Internal_AddPaddingVfprintf
                            (pCVar19,stream,(LPSTR)&uStack_4b8,local_45c + -1,local_47c);
          if (IVar5 == -1) goto LAB_0011ca81;
          iVar22 = iVar22 + IVar5;
        }
        else if (local_494 == 2) {
          if ((local_47c & 4) == 0) goto LAB_0011c944;
          uVar9 = _auStack_458 & 0xffffffff;
          if (uVar9 < 0x29) {
            _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
            puVar13 = (undefined8 *)(uVar9 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar13 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          pCVar19 = (CPalThread *)*puVar13;
          pthrCurrent_00 = pCVar19;
          sVar14 = strlen((char *)pCVar19);
          iVar6 = Internal_AddPaddingVfprintf
                            (pthrCurrent_00,local_488,(LPSTR)pCVar19,local_45c - (int)sVar14,uVar23)
          ;
          stream = local_488;
          if (iVar6 == -1) goto LAB_0011ca81;
LAB_0011ca5c:
          iVar22 = iVar22 + iVar6;
          pIVar8 = pIVar11;
        }
        else {
          if (local_494 == 5 && (local_498 ^ 1) == 0) {
            uVar9 = _auStack_458 & 0xffffffff;
            if (uVar9 < 0x29) {
              _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
              psVar15 = (short *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              psVar15 = (short *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            iVar6 = fprintf((FILE *)stream->bsdFilePtr,local_438,(long)*psVar15);
          }
          else {
            if ((local_498 ^ 1) != 0 || local_494 != 4) goto LAB_0011c944;
            uVar9 = _auStack_458 & 0xffffffff;
            if (uVar9 < 0x29) {
              _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
              psVar15 = (short *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              psVar15 = (short *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            iVar6 = fprintf((FILE *)stream->bsdFilePtr,local_438,(ulong)(uint)(int)*psVar15);
          }
LAB_0011ca54:
          if (iVar6 != -1) goto LAB_0011ca5c;
          pIVar8 = pIVar11;
          if (PAL_InitializeChakraCoreCalled == false) {
LAB_0011ca91:
            abort();
          }
        }
      }
      goto LAB_0011c2e6;
    }
    if (local_45c == -3) {
      if ((uint)auStack_458 < 0x29) {
        _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      IVar5 = -3;
    }
    else {
      IVar5 = local_45c;
      if (local_45c == -2) {
        uVar9 = _auStack_458 & 0xffffffff;
        if (uVar9 < 0x29) {
          _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8);
          pIVar8 = (INT *)(uVar9 + (long)ap[0].overflow_arg_area);
        }
        else {
          pIVar8 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        IVar5 = *pIVar8;
        local_45c = IVar5;
      }
    }
    uVar9 = _auStack_458 & 0xffffffff;
    if (Fmt._4_4_ == 0xfffffffc) {
      if ((uint)auStack_458 < 0x29) {
        uVar9 = (ulong)((int)auStack_458 + 8U);
        _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8U);
        uVar21 = 0xfffffffc;
        goto LAB_0011c535;
      }
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
      uVar21 = 0xfffffffc;
LAB_0011c55c:
      puVar13 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    else {
      uVar21 = Fmt._4_4_;
      if (Fmt._4_4_ == 0xfffffffe) {
        if ((uint)auStack_458 < 0x29) {
          puVar17 = (uint *)((long)ap[0].overflow_arg_area + uVar9);
          uVar9 = (ulong)((int)auStack_458 + 8U);
          _auStack_458 = CONCAT44(Width,(int)auStack_458 + 8U);
        }
        else {
          puVar17 = (uint *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        uVar21 = *puVar17;
        Fmt._4_4_ = uVar21;
      }
LAB_0011c535:
      if (0x28 < (uint)uVar9) goto LAB_0011c55c;
      _auStack_458 = CONCAT44(Width,(uint)uVar9 + 8);
      puVar13 = (undefined8 *)(uVar9 + (long)ap[0].overflow_arg_area);
    }
    lpWideCharStr = (LPCWSTR)*puVar13;
    iVar4 = WideCharToMultiByte(0,0,lpWideCharStr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar4 == 0) {
      uVar20 = 0x8fb;
      goto LAB_0011cb10;
    }
    pCVar19 = (CPalThread *)(long)iVar4;
    Prefix = IVar5;
    lpMultiByteStr = (LPSTR)CorUnix::InternalMalloc((size_t)pCVar19);
    if (lpMultiByteStr == (LPSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled != false) {
        piVar16 = __errno_location();
        *piVar16 = 8;
        goto LAB_0011cbaa;
      }
      goto LAB_0011ca91;
    }
    pCVar10 = lpMultiByteStr;
    uVar23 = 0;
    Type = iVar22;
    if (uVar21 == 0xfffffffd) {
LAB_0011c604:
      *pCVar10 = '\0';
LAB_0011c62f:
      stream = local_488;
      IVar5 = Internal_AddPaddingVfprintf
                        (pCVar19,local_488,lpMultiByteStr,Prefix - uVar23,local_47c);
      if (IVar5 != -1) {
        iVar22 = Type + IVar5;
        CorUnix::InternalFree(lpMultiByteStr);
        pIVar8 = pIStack_468;
        goto LAB_0011c2e6;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011ca91;
    }
    else {
      uVar23 = iVar4 - 1;
      if (((int)uVar21 < 1) || ((int)uVar23 <= (int)uVar21)) {
        pCVar19 = (CPalThread *)0x0;
        iVar22 = WideCharToMultiByte(0,0,lpWideCharStr,-1,lpMultiByteStr,iVar4,(LPCSTR)0x0,
                                     (LPBOOL)0x0);
        if (iVar22 != 0) goto LAB_0011c62f;
        uVar20 = 0x928;
      }
      else {
        pCVar19 = (CPalThread *)0x0;
        iVar22 = WideCharToMultiByte(0,0,lpWideCharStr,uVar21,lpMultiByteStr,iVar4,(LPCSTR)0x0,
                                     (LPBOOL)0x0);
        if (iVar22 != 0) {
          pCVar10 = lpMultiByteStr + iVar22;
          uVar23 = uVar21;
          goto LAB_0011c604;
        }
        uVar20 = 0x917;
      }
      fprintf(_stderr,"] %s %s:%d","CoreVfprintf",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
              ,uVar20);
      pFVar1 = _stderr;
      DVar7 = GetLastError();
      fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
    }
    CorUnix::InternalFree(lpMultiByteStr);
  }
  else {
    if (*(char *)&pCStack_478->_vptr_CPalThread == '\0') goto LAB_0011cbb0;
LAB_0011c3a2:
    pCVar19 = pCStack_478;
    pCStack_478 = (CPalThread *)((long)&pCStack_478->_vptr_CPalThread + 1);
    CorUnix::InternalFwrite(pCVar19,1,1,stream->bsdFilePtr,pIVar8);
    if (stream->PALferrorCode != 1) {
      iVar22 = iVar22 + 1;
      goto LAB_0011c2e6;
    }
LAB_0011ca81:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011ca91;
  }
LAB_0011cbaa:
  iVar22 = -1;
LAB_0011cbb0:
  if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
    __stack_chk_fail();
  }
  return iVar22;
}

Assistant:

int CoreVfprintf(CPalThread *pthrCurrent, PAL_FILE *stream, const char *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCSTR Fmt = format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    int written = 0;
    int paddingReturnValue;
    va_list ap;

    PERF_ENTRY(vfprintf);

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (*Fmt == '%' &&
            TRUE == Internal_ExtractFormatA(pthrCurrent, &Fmt, TempBuff, &Flags,
                                            &Width, &Precision,
                                            &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1, 0,
                                             0, 0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) InternalMalloc(Length);
                if (!TempStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = WideCharToMultiByte(CP_ACP, 0, TempWStr,
                                                 Precision, TempStr, Length,
                                                 0, 0);
                    if (!Length)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        PERF_EXIT(vfprintf);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1,
                                                       TempStr, Length, 0, 0);
                    if (!wctombResult)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        PERF_EXIT(vfprintf);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Internal_AddPaddingVfprintf(pthrCurrent, stream, TempStr,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    InternalFree(TempStr);
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

                InternalFree(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[5];
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = WideCharToMultiByte(CP_ACP, 0, &TempWChar, 1,
                                             TempBuffer, sizeof(TempBuffer),
                                             0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Internal_AddPaddingVfprintf(pthrCurrent, stream, TempBuffer,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of fprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                paddingReturnValue = Internal_AddPaddingVfprintf(
                                                pthrCurrent,
                                                stream,
                                                ch,
                                                Width - Length,
                                                Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of fprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                paddingReturnValue = Internal_AddPaddingVfprintf(
                                                pthrCurrent,
                                                stream,
                                                tempStr,
                                                Width - Length,
                                                Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;
            }
            else
            {
                // Types that fprintf can handle.
                TempInt = 0;

                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = fprintf(stream->bsdFilePtr, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = fprintf( stream->bsdFilePtr, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vfprintf(stream->bsdFilePtr, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (-1 == TempInt)
                {
                    ERROR("vfprintf returned an error\n");
                }
                else
                {
                    written += TempInt;
                }
            }
        }
        else
        {

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
            clearerr (stream->bsdFilePtr);
#endif

            InternalFwrite(Fmt++, 1, 1, stream->bsdFilePtr, &stream->PALferrorCode); /* copy regular chars into buffer */
            if (stream->PALferrorCode == PAL_FILE_ERROR)
            {
                ERROR("fwrite() failed with errno == %d\n", errno);
                PERF_EXIT(vfprintf);
                va_end(ap);
                return -1;
            }
            ++written;
        }
    }

    va_end(ap);

    PERF_EXIT(vfprintf);
    return written;
}